

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O0

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::StartStateRowProbs::operator()
          (StartStateRowProbs *this,iterator_t *str,iterator_t *end)

{
  bool bVar1;
  undefined8 uVar2;
  reference pvVar3;
  size_type sVar4;
  DecPOMDPDiscrete *pDVar5;
  size_type sVar6;
  ostream *poVar7;
  E *this_00;
  ostream *poVar8;
  MultiAgentDecisionProcessDiscrete *this_01;
  long *in_RDI;
  StateDistributionVector *isd;
  stringstream ss;
  string err;
  StateDistribution *in_stack_fffffffffffffd88;
  ParserDPOMDPFormat_Spirit *in_stack_fffffffffffffd90;
  MultiAgentDecisionProcessDiscrete *a;
  StateDistributionVector *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffdb8;
  E *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  stringstream local_1d8 [16];
  ostream local_1c8 [383];
  allocator<char> local_49;
  string local_48 [72];
  
  if (*(int *)(*in_RDI + 0x40) == 5) {
    GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
    MultiAgentDecisionProcessDiscrete::SetUniformISD((MultiAgentDecisionProcessDiscrete *)0xa33c0a);
  }
  else {
    bVar1 = IsRowMatrixLP(in_stack_fffffffffffffd90);
    if (!bVar1) {
      uVar2 = __cxa_allocate_exception(0x28);
      E::E(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      __cxa_throw(uVar2,&E::typeinfo,E::~E);
    }
    pvVar3 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(*in_RDI + 0x60),0);
    sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
    pDVar5 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
    sVar6 = (**(code **)(*(long *)&(pDVar5->super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 0x30))();
    if (sVar4 != sVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                 (allocator<char> *)in_stack_fffffffffffffdc0);
      std::allocator<char>::~allocator(&local_49);
      std::__cxx11::string::operator+=(local_48," [0] should contain NrStates(=");
      std::__cxx11::stringstream::stringstream(local_1d8);
      poVar7 = std::operator<<(local_1c8,"StartStateRowProbs: _m_po->_m_curMatrix[0] ");
      poVar7 = std::operator<<(poVar7,"should contain NrStates(=");
      pDVar5 = GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
      this_00 = (E *)(**(code **)(*(long *)&(pDVar5->super_MultiAgentDecisionProcessDiscrete).
                                            super_MultiAgentDecisionProcess + 0x30))();
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(ulong)this_00);
      poVar8 = std::operator<<(poVar7,") entries! (not ");
      pvVar3 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(*in_RDI + 0x60),0);
      sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar3);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar4);
      std::operator<<(poVar8,")\n");
      uVar2 = __cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      E::E(this_00,(char *)poVar7);
      __cxa_throw(uVar2,&E::typeinfo,E::~E);
    }
    this_01 = (MultiAgentDecisionProcessDiscrete *)operator_new(0x20);
    a = this_01;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)(*in_RDI + 0x60),0);
    StateDistributionVector::StateDistributionVector(in_stack_fffffffffffffda0,(SDV *)a);
    GetDecPOMDPDiscrete((ParserDPOMDPFormat_Spirit *)*in_RDI);
    MultiAgentDecisionProcessDiscrete::SetISD(this_01,in_stack_fffffffffffffd88);
  }
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const            
            {
                if(_m_po->_m_lp_type == UNIFORM)
                {
                    _m_po->GetDecPOMDPDiscrete()->SetUniformISD();
                    return;
                }

                //check size - it should be a row matrix...
                if( !_m_po->IsRowMatrixLP() )        
                    throw E("StartStateRowProbs: _m_po->_m_curMatrix should \
                           be a row vector!");
                if(_m_po->_m_curMatrix[0].size() != _m_po->GetDecPOMDPDiscrete()->
                        GetNrStates())
                {
                    std::string err = "StartStateRowProbs: _m_po->_m_curMatrix";
                    err += " [0] should contain NrStates(="; 
                    std::stringstream ss;
                    ss << "StartStateRowProbs: _m_po->_m_curMatrix[0] " << 
                        "should contain NrStates(=" << _m_po->GetDecPOMDPDiscrete()->
                        GetNrStates() << ") entries! (not "<<
                        _m_po->_m_curMatrix[0].size()<<")\n";

                    throw E( ss.str().c_str() );
                }

                StateDistributionVector *isd=new StateDistributionVector(_m_po->_m_curMatrix[0]);
                _m_po->GetDecPOMDPDiscrete()->SetISD(isd);
            }